

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_encrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  uint8_t *puVar1;
  size_t sVar2;
  ptls_buffer_t *ppVar3;
  int iVar4;
  int iVar5;
  EVP_CIPHER_CTX *ctx;
  HMAC_CTX *ctx_00;
  long lVar6;
  uchar *puVar7;
  int clen;
  int local_44;
  ptls_buffer_t *local_40;
  uint8_t *local_38;
  
  ctx = EVP_CIPHER_CTX_new();
  iVar4 = 0x201;
  if ((ctx == (EVP_CIPHER_CTX *)0x0) ||
     (local_40 = buf, ctx_00 = (HMAC_CTX *)HMAC_CTX_new(), ppVar3 = local_40,
     ctx_00 == (HMAC_CTX *)0x0)) {
    ctx_00 = (HMAC_CTX *)0x0;
  }
  else {
    local_38 = src.base;
    iVar4 = ptls_buffer_reserve(local_40,src.len + 0x80);
    if (iVar4 == 0) {
      puVar1 = ppVar3->base;
      sVar2 = ppVar3->off;
      puVar7 = puVar1 + sVar2;
      iVar5 = (*cb)(puVar7,puVar1 + sVar2 + 0x10,(EVP_CIPHER_CTX *)ctx,(HMAC_CTX *)ctx_00,1);
      iVar4 = 0x203;
      if (iVar5 != 0) {
        puVar7 = puVar7 + 0x20;
        iVar5 = EVP_EncryptUpdate(ctx,puVar7,&local_44,local_38,(int)src.len);
        if (iVar5 != 0) {
          lVar6 = (long)local_44;
          iVar5 = EVP_EncryptFinal_ex(ctx,puVar7 + lVar6,&local_44);
          if (iVar5 != 0) {
            puVar7 = puVar7 + lVar6 + local_44;
            iVar5 = HMAC_Update(ctx_00,local_40->base + local_40->off,
                                (long)puVar7 - (long)(local_40->base + local_40->off));
            if ((iVar5 != 0) && (iVar5 = HMAC_Final(ctx_00,puVar7,(uint *)0x0), iVar5 != 0)) {
              lVar6 = HMAC_size(ctx_00);
              if (local_40->base + local_40->capacity < puVar7 + lVar6) {
                __assert_fail("dst <= buf->base + buf->capacity",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/openssl.c"
                              ,0x532,
                              "int ptls_openssl_encrypt_ticket(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, HMAC_CTX *, int))"
                             );
              }
              local_40->off = (long)(puVar7 + lVar6) - (long)local_40->base;
              iVar4 = 0;
            }
          }
        }
      }
    }
  }
  if (ctx != (EVP_CIPHER_CTX *)0x0) {
    cleanup_cipher_ctx((EVP_CIPHER_CTX *)ctx);
  }
  if (ctx_00 != (HMAC_CTX *)0x0) {
    HMAC_CTX_free(ctx_00);
  }
  return iVar4;
}

Assistant:

int ptls_openssl_encrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!HMAC_Update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) || !HMAC_Final(hctx, dst, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += HMAC_size(hctx);

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        cleanup_cipher_ctx(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}